

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::sort_partition
          (Suffix_Array<unsigned_int> *this,idx_t *X,idx_t *Y,idx_t n,idx_t *S,idx_t *LCP_x,
          idx_t *LCP_y)

{
  uint in_ECX;
  int *in_R8;
  anon_class_72_9_784720f0 g;
  anon_class_56_7_cdff25e5 f;
  idx_t flat_count_r;
  idx_t flat_count_l;
  idx_t m;
  anon_class_72_9_784720f0 *in_stack_ffffffffffffff18;
  anon_class_72_9_784720f0 *in_stack_ffffffffffffff20;
  idx_t *LCP_x_00;
  idx_t len_y;
  uint *Y_00;
  idx_t len_x;
  idx_t *X_00;
  Suffix_Array<unsigned_int> *this_00;
  idx_t *LCP_y_00;
  idx_t *Z;
  uint *LCP_z;
  uint local_34;
  
  if (in_ECX != 1) {
    local_34 = in_ECX >> 1;
    LCP_y_00 = (idx_t *)&stack0xffffffffffffffe8;
    Z = (idx_t *)&stack0xfffffffffffffff0;
    LCP_z = &local_34;
    LCP_x_00 = (idx_t *)&stack0xfffffffffffffff0;
    len_y = (idx_t)((ulong)&stack0xffffffffffffffe4 >> 0x20);
    Y_00 = &local_34;
    len_x = (idx_t)((ulong)&stack0xffffffffffffffd8 >> 0x20);
    X_00 = (idx_t *)&stack0x00000008;
    this_00 = (Suffix_Array<unsigned_int> *)&stack0xffffffffffffffd0;
    if (((uint)(in_R8[local_34] - *in_R8) < 0x2000) ||
       ((uint)(in_R8[in_ECX] - in_R8[local_34]) < 0x2000)) {
      sort_partition::anon_class_56_7_cdff25e5::operator()
                ((anon_class_56_7_cdff25e5 *)in_stack_ffffffffffffff20);
      sort_partition::anon_class_72_9_784720f0::operator()(in_stack_ffffffffffffff20);
    }
    else {
      parlay::
      par_do<CaPS_SA::Suffix_Array<unsigned_int>::sort_partition(unsigned_int*,unsigned_int*,unsigned_int,unsigned_int_const*,unsigned_int*,unsigned_int*)::_lambda()_1_const&,CaPS_SA::Suffix_Array<unsigned_int>::sort_partition(unsigned_int*,unsigned_int*,unsigned_int,unsigned_int_const*,unsigned_int*,unsigned_int*)::_lambda()_2_const&>
                ((anon_class_56_7_cdff25e5 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 false);
    }
    merge(this_00,X_00,len_x,Y_00,len_y,LCP_x_00,LCP_y_00,Z,LCP_z);
  }
  return;
}

Assistant:

void Suffix_Array<T_idx_>::sort_partition(idx_t* const X, idx_t* const Y, const idx_t n, const idx_t* const S, idx_t* const LCP_x, idx_t* const LCP_y)
{
    if(n == 1)
        return;

    const auto m = n / 2;
    const auto flat_count_l = S[m] - S[0];
    const auto flat_count_r = S[n] - S[m];

    const auto f = [&](){ sort_partition(Y, X, m, S, LCP_y, LCP_x); };
    const auto g = [&](){ sort_partition(Y + flat_count_l, X + flat_count_l, n - m, S + m, LCP_y + flat_count_l, LCP_x + flat_count_l); };

    (flat_count_l < nested_par_grain_size || flat_count_r < nested_par_grain_size) ?
        (f(), g()) : parlay::par_do(f, g);
    merge(X, flat_count_l, X + flat_count_l, flat_count_r, LCP_x, LCP_x + flat_count_l, Y, LCP_y);
}